

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderOutput.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderDuplicateOutputLayoutQualifierTest::iterate
          (GeometryShaderDuplicateOutputLayoutQualifierTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  NotSupportedError *this_01;
  char *description;
  TestContext *this_02;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if ((this->super_GeometryShaderOutput).super_TestCaseBase.m_is_geometry_shader_extension_supported
      != false) {
    bVar1 = TestCaseBase::doesProgramBuild
                      ((TestCaseBase *)this,1,
                       &GeometryShaderOutput::m_fragment_shader_code_white_color,1,
                       &m_geometry_shader_code,1,
                       &GeometryShaderOutput::m_vertex_shader_code_two_vec4);
    if (!bVar1) {
      this_02 = (this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
                m_testCtx;
      description = "Pass";
    }
    else {
      local_190._0_8_ =
           ((this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_190 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Invalid program was linked successfully.",0x28);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_118);
      this_02 = (this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
                m_testCtx;
      description = "Fail";
    }
    tcu::TestContext::setTestResult(this_02,(uint)bVar1,description);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
             ,0xe7);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderDuplicateOutputLayoutQualifierTest::iterate()
{
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Verify the program does not build. */
	bool result = doesProgramBuild(1, &m_fragment_shader_code_white_color, 1, &m_geometry_shader_code, 1,
								   &m_vertex_shader_code_two_vec4);

	if (false == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid program was linked successfully."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}